

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::snarfBufferedLineBreak(HttpInputStreamImpl *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  
  bVar1 = this->lineBreakBeforeNextHeader;
  if ((bVar1 & 1U) != 0) {
    sVar4 = (this->leftover).size_;
    pcVar2 = (this->leftover).ptr;
    do {
      sVar4 = sVar4 - 1;
      pcVar3 = pcVar2 + 1;
      if (sVar4 == 0xffffffffffffffff) {
        return;
      }
      if (*pcVar2 != '\r') {
        if (*pcVar2 == '\n') {
          (this->leftover).ptr = pcVar3;
          (this->leftover).size_ = sVar4;
        }
        this->lineBreakBeforeNextHeader = false;
        return;
      }
      (this->leftover).ptr = pcVar3;
      (this->leftover).size_ = sVar4;
      pcVar2 = pcVar3;
    } while ((bVar1 & 1U) != 0);
  }
  return;
}

Assistant:

void snarfBufferedLineBreak() {
    // Slightly-crappy code to snarf the expected line break. This will actually eat the leading
    // regex /\r*\n?/.
    while (lineBreakBeforeNextHeader && leftover.size() > 0) {
      if (leftover[0] == '\r') {
        leftover = leftover.slice(1, leftover.size());
      } else if (leftover[0] == '\n') {
        leftover = leftover.slice(1, leftover.size());
        lineBreakBeforeNextHeader = false;
      } else {
        // Err, missing line break, whatever.
        lineBreakBeforeNextHeader = false;
      }
    }
  }